

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IForReader.cpp
# Opt level: O1

bool __thiscall IForReader::forward(IForReader *this,int base_pos,int end_pos)

{
  ostream *poVar1;
  ssize_t sVar2;
  size_t __nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  undefined1 uVar3;
  uint deep;
  int iVar4;
  ifstream *piVar5;
  ISentenceReader iSentenceReader;
  ISingleCharReader iBracket1lReader;
  IBlockReader iBlockReader;
  ISingleStringReader iForStringReader;
  ISentenceReader iSentenceReader2;
  string local_250;
  string local_230;
  string local_210;
  ISentenceReader local_1f0;
  ISingleCharReader local_188;
  IBlockReader local_140;
  ISingleStringReader local_f8;
  ISentenceReader local_98;
  
  IBlockReader::IBlockReader
            (&local_140,(this->super_IAbstractReader).m_ifs,(this->super_IAbstractReader).m_os,
             (this->super_IAbstractReader).m_deep + 1);
  ISentenceReader::ISentenceReader
            (&local_1f0,(this->super_IAbstractReader).m_ifs,(this->super_IAbstractReader).m_os,
             (this->super_IAbstractReader).m_deep + 1,';');
  ISentenceReader::ISentenceReader
            (&local_98,(this->super_IAbstractReader).m_ifs,(this->super_IAbstractReader).m_os,
             (this->super_IAbstractReader).m_deep + 1,')');
  piVar5 = (this->super_IAbstractReader).m_ifs;
  poVar1 = (this->super_IAbstractReader).m_os;
  iVar4 = (this->super_IAbstractReader).m_deep;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Bracket1l","");
  ISingleCharReader::ISingleCharReader(&local_188,piVar5,poVar1,iVar4 + 1,'(',&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  piVar5 = (this->super_IAbstractReader).m_ifs;
  poVar1 = (this->super_IAbstractReader).m_os;
  iVar4 = (this->super_IAbstractReader).m_deep;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"for","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Keyword","");
  deep = iVar4 + 1;
  __nbytes = (size_t)deep;
  ISingleStringReader::ISingleStringReader(&local_f8,piVar5,poVar1,deep,&local_230,&local_250);
  iVar4 = (int)piVar5;
  __buf = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
    __buf = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
    __buf = extraout_RDX_01;
  }
  sVar2 = IAbstractReader::read(&local_f8.super_IAbstractReader,iVar4,__buf,__nbytes);
  if ((char)sVar2 != '\0') {
    sVar2 = IAbstractReader::read(&local_188.super_IAbstractReader,iVar4,__buf_00,__nbytes);
    if ((char)sVar2 != '\0') {
      sVar2 = IAbstractReader::read(&local_1f0.super_IAbstractReader,iVar4,__buf_01,__nbytes);
      if ((char)sVar2 != '\0') {
        sVar2 = IAbstractReader::read(&local_1f0.super_IAbstractReader,iVar4,__buf_02,__nbytes);
        if ((char)sVar2 != '\0') {
          sVar2 = IAbstractReader::read(&local_98.super_IAbstractReader,iVar4,__buf_03,__nbytes);
          if ((char)sVar2 != '\0') {
            sVar2 = IAbstractReader::read(&local_140.super_IAbstractReader,iVar4,__buf_04,__nbytes);
            uVar3 = 1;
            if ((char)sVar2 == '\0') {
              sVar2 = IAbstractReader::read
                                (&local_1f0.super_IAbstractReader,iVar4,__buf_05,__nbytes);
              uVar3 = (undefined1)sVar2;
            }
            goto LAB_0010a968;
          }
        }
      }
    }
  }
  uVar3 = 0;
LAB_0010a968:
  local_f8.super_IAbstractReader._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00110c00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.m_str._M_dataplus._M_p != &local_f8.m_str.field_2) {
    operator_delete(local_f8.m_str._M_dataplus._M_p);
  }
  local_f8.super_IAbstractReader._vptr_IAbstractReader =
       (_func_int **)&PTR___cxa_pure_virtual_001109d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.super_IAbstractReader.m_dataType._M_dataplus._M_p !=
      &local_f8.super_IAbstractReader.m_dataType.field_2) {
    operator_delete(local_f8.super_IAbstractReader.m_dataType._M_dataplus._M_p);
  }
  local_188.super_IAbstractReader._vptr_IAbstractReader =
       (_func_int **)&PTR___cxa_pure_virtual_001109d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.super_IAbstractReader.m_dataType._M_dataplus._M_p !=
      &local_188.super_IAbstractReader.m_dataType.field_2) {
    operator_delete(local_188.super_IAbstractReader.m_dataType._M_dataplus._M_p);
  }
  local_98.super_IAbstractReader._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00110a08;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_defining._M_dataplus._M_p != &local_98.m_defining.field_2) {
    operator_delete(local_98.m_defining._M_dataplus._M_p);
  }
  local_98.super_IAbstractReader._vptr_IAbstractReader =
       (_func_int **)&PTR___cxa_pure_virtual_001109d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.super_IAbstractReader.m_dataType._M_dataplus._M_p !=
      &local_98.super_IAbstractReader.m_dataType.field_2) {
    operator_delete(local_98.super_IAbstractReader.m_dataType._M_dataplus._M_p);
  }
  local_1f0.super_IAbstractReader._vptr_IAbstractReader = (_func_int **)&PTR_getWord_00110a08;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_defining._M_dataplus._M_p != &local_1f0.m_defining.field_2) {
    operator_delete(local_1f0.m_defining._M_dataplus._M_p);
  }
  local_1f0.super_IAbstractReader._vptr_IAbstractReader =
       (_func_int **)&PTR___cxa_pure_virtual_001109d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.super_IAbstractReader.m_dataType._M_dataplus._M_p !=
      &local_1f0.super_IAbstractReader.m_dataType.field_2) {
    operator_delete(local_1f0.super_IAbstractReader.m_dataType._M_dataplus._M_p);
  }
  local_140.super_IAbstractReader._vptr_IAbstractReader =
       (_func_int **)&PTR___cxa_pure_virtual_001109d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.super_IAbstractReader.m_dataType._M_dataplus._M_p !=
      &local_140.super_IAbstractReader.m_dataType.field_2) {
    operator_delete(local_140.super_IAbstractReader.m_dataType._M_dataplus._M_p);
  }
  return (bool)uVar3;
}

Assistant:

bool IForReader::forward(int base_pos, int end_pos) {
    IBlockReader iBlockReader(m_ifs,m_os,m_deep+1);
    ISentenceReader iSentenceReader(m_ifs,m_os,m_deep+1);
    ISentenceReader iSentenceReader2(m_ifs,m_os,m_deep+1,')');
    ISingleCharReader iBracket1lReader(m_ifs, m_os, m_deep + 1,'(',"Bracket1l");
    ISingleStringReader iForStringReader(m_ifs, m_os, m_deep + 1,"for");

    if(!iForStringReader.read())
        return false;
    if(!iBracket1lReader.read())
        return false;

    if(!iSentenceReader.read())
        return false;
    if(!iSentenceReader.read())
        return false;
    if(!iSentenceReader2.read())
        return false;

    return !(!iBlockReader.read() && !iSentenceReader.read());
}